

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapES5ArrayGetterSetterEntry *pSVar1;
  SnapES5ArrayInfo *pSVar2;
  ulong uVar3;
  long lVar4;
  
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar2->GetterSetterCount,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)pSVar2->IsLengthWritable);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < pSVar2->GetterSetterCount; uVar3 = uVar3 + 1) {
    pSVar1 = pSVar2->GetterSetterEntries;
    (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar4 != 0));
    FileWriter::WriteUInt32(writer,index,*(uint32 *)((long)&pSVar1->Index + lVar4),NoSeparator);
    FileWriter::WriteUInt32(writer,attributeFlags,(uint)(&pSVar1->Attributes)[lVar4],CommaSeparator)
    ;
    (*writer->_vptr_FileWriter[3])(writer,0x15,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)((long)&pSVar1->Getter + lVar4),writer,NoSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x16,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)((long)&pSVar1->Setter + lVar4),writer,NoSeparator);
    (*writer->_vptr_FileWriter[7])(writer);
    lVar4 = lVar4 + 0x18;
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  EmitAddtlInfo_SnapArrayInfoCore<void*>(pSVar2->BasicArrayData,writer);
  return;
}

Assistant:

void EmitAddtlInfo_SnapES5ArrayInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            writer->WriteLengthValue(es5Info->GetterSetterCount, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, es5Info->IsLengthWritable, NSTokens::Separator::CommaSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                writer->WriteRecordStart(sep);

                writer->WriteUInt32(NSTokens::Key::index, entry->Index);
                writer->WriteUInt32(NSTokens::Key::attributeFlags, entry->Attributes, NSTokens::Separator::CommaSeparator);

                writer->WriteKey(NSTokens::Key::getterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Getter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteKey(NSTokens::Key::setterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Setter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            EmitAddtlInfo_SnapArrayInfoCore<TTDVar>(es5Info->BasicArrayData, writer);
        }